

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.h
# Opt level: O0

void __thiscall
sigslot::
_signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
::slot_duplicate(_signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
                 *this,has_slots<sigslot::multi_threaded_local> *oldtarget,
                has_slots<sigslot::multi_threaded_local> *newtarget)

{
  bool bVar1;
  reference pp_Var2;
  has_slots<sigslot::multi_threaded_local> *phVar3;
  value_type local_50 [3];
  _Self local_38;
  iterator itEnd;
  iterator it;
  lock_block<sigslot::multi_threaded_local> lock;
  has_slots<sigslot::multi_threaded_local> *newtarget_local;
  has_slots<sigslot::multi_threaded_local> *oldtarget_local;
  _signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
  *this_local;
  
  lock_block<sigslot::multi_threaded_local>::lock_block
            ((lock_block<sigslot::multi_threaded_local> *)&it,(multi_threaded_local *)this);
  itEnd._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
       ::begin(&this->m_connected_slots);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
       ::end(&this->m_connected_slots);
  while( true ) {
    bVar1 = std::operator!=(&itEnd,&local_38);
    if (!bVar1) break;
    pp_Var2 = std::
              _List_iterator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>
              ::operator*(&itEnd);
    phVar3 = (has_slots<sigslot::multi_threaded_local> *)(**(code **)(*(long *)*pp_Var2 + 0x10))();
    if (phVar3 == oldtarget) {
      pp_Var2 = std::
                _List_iterator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>
                ::operator*(&itEnd);
      local_50[0] = (value_type)(**(code **)(*(long *)*pp_Var2 + 0x28))(*pp_Var2,newtarget);
      std::__cxx11::
      list<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
      ::push_back(&this->m_connected_slots,local_50);
    }
    std::
    _List_iterator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>
    ::operator++(&itEnd);
  }
  lock_block<sigslot::multi_threaded_local>::~lock_block
            ((lock_block<sigslot::multi_threaded_local> *)&it);
  return;
}

Assistant:

void slot_duplicate(const has_slots<mt_policy>* oldtarget, has_slots<mt_policy>* newtarget)
		{
			lock_block<mt_policy> lock(this);
			iterator it = m_connected_slots.begin();
			iterator itEnd = m_connected_slots.end();

			while(it != itEnd)
			{
				if((*it)->getdest() == oldtarget)
				{
					m_connected_slots.push_back((*it)->duplicate(newtarget));
				}

				++it;
			}
		}